

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::
AdapterPromiseNode<capnp::AnyPointer::Pipeline,kj::_::PromiseAndFulfillerAdapter<capnp::AnyPointer::Pipeline>>
::AdapterPromiseNode<kj::_::WeakFulfiller<capnp::AnyPointer::Pipeline>&>
          (AdapterPromiseNode<capnp::AnyPointer::Pipeline,kj::_::PromiseAndFulfillerAdapter<capnp::AnyPointer::Pipeline>>
           *this,WeakFulfiller<capnp::AnyPointer::Pipeline> *params)

{
  WeakFulfiller<capnp::AnyPointer::Pipeline> *wrapper;
  WeakFulfiller<capnp::AnyPointer::Pipeline> *params_local;
  AdapterPromiseNode<capnp::AnyPointer::Pipeline,_kj::_::PromiseAndFulfillerAdapter<capnp::AnyPointer::Pipeline>_>
  *this_local;
  
  AdapterPromiseNodeBase::AdapterPromiseNodeBase((AdapterPromiseNodeBase *)this);
  PromiseFulfiller<capnp::AnyPointer::Pipeline>::PromiseFulfiller
            ((PromiseFulfiller<capnp::AnyPointer::Pipeline> *)(this + 0x10));
  *(undefined ***)this = &PTR_onReady_005cfc58;
  *(undefined ***)(this + 0x10) = &PTR_fulfill_005cfca0;
  ExceptionOr<capnp::AnyPointer::Pipeline>::ExceptionOr
            ((ExceptionOr<capnp::AnyPointer::Pipeline> *)(this + 0x18));
  this[0x1a8] = (AdapterPromiseNode<capnp::AnyPointer::Pipeline,kj::_::PromiseAndFulfillerAdapter<capnp::AnyPointer::Pipeline>>
                 )0x1;
  wrapper = fwd<kj::_::WeakFulfiller<capnp::AnyPointer::Pipeline>&>(params);
  PromiseAndFulfillerAdapter<capnp::AnyPointer::Pipeline>::PromiseAndFulfillerAdapter
            ((PromiseAndFulfillerAdapter<capnp::AnyPointer::Pipeline> *)(this + 0x1b0),
             (PromiseFulfiller<capnp::AnyPointer::Pipeline> *)(this + 0x10),wrapper);
  return;
}

Assistant:

AdapterPromiseNode(Params&&... params)
      : adapter(static_cast<PromiseFulfiller<UnfixVoid<T>>&>(*this), kj::fwd<Params>(params)...) {}